

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderExecUtil::TessControlExecutor::TessControlExecutor
          (TessControlExecutor *this,RenderContext *renderCtx,ShaderSpec *shaderSpec)

{
  GLSLVersion version;
  BufferIoExecutor *pBVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  GLSLVersion version_00;
  GLSLVersion version_01;
  ShaderSpec *shaderSpec_00;
  long lVar4;
  BufferIoExecutor *local_378;
  uint local_370;
  value_type local_368;
  string local_348;
  long *local_328;
  long local_320;
  long local_318 [2];
  string local_308;
  string local_2e8;
  uint local_2c8;
  value_type local_2c0;
  uint local_2a0;
  value_type local_298;
  undefined1 local_278 [8];
  value_type local_270 [3];
  ios_base local_208 [264];
  ProgramSources local_100;
  
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_378 = &this->super_BufferIoExecutor;
  memset(&local_100,0,0xac);
  generateVertexShaderForTess_abi_cxx11_
            (&local_2e8,(ShaderExecUtil *)(ulong)shaderSpec->version,version_00);
  local_2a0 = 0;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_2e8._M_dataplus._M_p,
             local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2a0,&local_298);
  generateTessControlShader_abi_cxx11_(&local_308,(TessControlExecutor *)shaderSpec,shaderSpec_00);
  local_370 = 3;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_308._M_dataplus._M_p,
             local_308._M_dataplus._M_p + local_308._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_370,&local_368);
  version = shaderSpec->version;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  __s = glu::getGLSLVersionDeclaration(version);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_378 +
                    (int)*(undefined8 *)(CONCAT44(local_278._4_4_,local_278._0_4_) + -0x18) + 0x100)
    ;
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  bVar2 = glu::glslVersionIsES(version);
  if (bVar2 && (int)version < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"#extension GL_EXT_tessellation_shader : require\n\n",0x31);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"layout(triangles, ccw) in;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\tgl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  local_2c8 = 4;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_328,local_320 + (long)local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2c8,&local_2c0);
  generateEmptyFragmentSource_abi_cxx11_
            (&local_348,(ShaderExecUtil *)(ulong)shaderSpec->version,version_01);
  local_278._0_4_ = 1;
  local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,local_348._M_dataplus._M_p,
             local_348._M_dataplus._M_p + local_348._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + (uint)local_278._0_4_,local_270);
  pBVar1 = local_378;
  BufferIoExecutor::BufferIoExecutor(local_378,renderCtx,shaderSpec,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != local_318) {
    operator_delete(local_328,local_318[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  (pBVar1->super_ShaderExecutor)._vptr_ShaderExecutor =
       (_func_int **)&PTR__TessControlExecutor_021c3120;
  return;
}

Assistant:

TessControlExecutor::TessControlExecutor (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec)
	: BufferIoExecutor	(renderCtx, shaderSpec, glu::ProgramSources()
							<< glu::VertexSource(generateVertexShaderForTess(shaderSpec.version))
							<< glu::TessellationControlSource(generateTessControlShader(shaderSpec))
							<< glu::TessellationEvaluationSource(generateEmptyTessEvalShader(shaderSpec.version))
							<< glu::FragmentSource(generateEmptyFragmentSource(shaderSpec.version)))
{
}